

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  stbi__uint32 *y_00;
  uchar uVar2;
  short sVar3;
  ushort uVar4;
  long lVar5;
  short sVar6;
  bool bVar7;
  stbi_uc asVar8 [4];
  stbi_uc sVar9;
  stbi_uc sVar10;
  byte bVar11;
  stbi_uc sVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  int iVar17;
  stbi__uint32 sVar18;
  stbi_uc asVar19 [4];
  int iVar20;
  stbi__uint32 sVar21;
  stbi__uint32 sVar22;
  stbi_uc asVar23 [4];
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  void *pvVar30;
  void *pvVar31;
  void *__s;
  stbi__uint16 *psVar32;
  stbi__jpeg *psVar33;
  stbi_uc *psVar34;
  long lVar35;
  code *pcVar36;
  undefined8 uVar37;
  undefined1 uVar38;
  int iVar39;
  char *pcVar40;
  ulong uVar41;
  undefined1 *puVar42;
  short sVar43;
  uint uVar44;
  uint uVar45;
  int req_comp_00;
  int req_comp_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  size_t __size;
  stbi__context *psVar46;
  long lVar47;
  stbi__jpeg *psVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  uint n;
  ulong uVar52;
  byte *pbVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  uint uVar57;
  uchar *puVar58;
  undefined4 in_register_00000084;
  int *piVar59;
  anon_struct_96_18_0d0905d3 *paVar60;
  int *piVar61;
  int left;
  short *psVar62;
  ulong uVar63;
  stbi_uc *psVar64;
  stbi_uc *psVar65;
  long *in_FS_OFFSET;
  bool bVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  stbi_uc (*local_8980) [4];
  void *local_8970;
  ulong local_8968;
  long local_8960;
  long local_8950;
  stbi__jpeg *local_8948;
  uint local_8908;
  uint local_88fc;
  stbi_uc value [4];
  int iStack_88f4;
  int iStack_88f0;
  uint uStack_88ec;
  uint local_88e8;
  uint uStack_88e4;
  uint uStack_88e0;
  int local_88d8;
  uint local_88cc;
  stbi_uc local_88b0;
  stbi_uc local_88af;
  stbi_uc local_88ae;
  stbi_uc local_88ad;
  stbi_uc rgbe [4];
  stbi_uc pal [256] [4];
  stbi_uc local_8474 [1024];
  undefined2 uStack_8074;
  undefined1 auStack_8072 [32770];
  stbi_uc (*local_70) [4];
  uint local_68;
  int local_64;
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  
  piVar59 = (int *)CONCAT44(in_register_00000084,req_comp);
  piVar59[0] = 8;
  piVar59[1] = 0;
  piVar59[2] = 0;
  piVar61 = piVar59;
  iVar17 = stbi__check_png_header(s);
  uVar44 = (uint)piVar61;
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar17 != 0) {
    pal._0_8_ = s;
    iVar17 = stbi__parse_png_file((stbi__png *)pal,0,4);
    uVar37 = pal._0_8_;
    if (iVar17 == 0) {
      psVar32 = (stbi__uint16 *)0x0;
      pvVar30 = (void *)pal._24_8_;
    }
    else {
      if ((int)pal[8] < 9) {
        iVar17 = 8;
      }
      else {
        if (pal[8] != (stbi_uc  [4])0x10) {
          lVar47 = *in_FS_OFFSET;
          pcVar40 = "bad bits_per_channel";
          goto LAB_00342722;
        }
        iVar17 = 0x10;
      }
      *piVar59 = iVar17;
      iVar17 = *(int *)(pal._0_8_ + 0xc);
      psVar32 = (stbi__uint16 *)pal._24_8_;
      if (iVar17 != 4) {
        if ((int)pal[8] < 9) {
          psVar32 = (stbi__uint16 *)
                    stbi__convert_format
                              ((uchar *)pal._24_8_,iVar17,*(int *)pal._0_8_,*(uint *)(pal._0_8_ + 4)
                               ,uVar44);
        }
        else {
          psVar32 = stbi__convert_format16
                              ((stbi__uint16 *)pal._24_8_,iVar17,*(int *)pal._0_8_,
                               *(uint *)(pal._0_8_ + 4),uVar44);
        }
        *(undefined4 *)(uVar37 + 0xc) = 4;
        if (psVar32 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(int *)uVar37;
      *y = *(int *)(uVar37 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar37 + 8);
      }
      pvVar30 = (void *)0x0;
    }
    free(pvVar30);
    free((void *)pal._16_8_);
    psVar33 = (stbi__jpeg *)pal._8_8_;
    goto LAB_0033f07f;
  }
  sVar9 = stbi__get8(s);
  if ((sVar9 == 'B') && (sVar9 = stbi__get8(s), sVar9 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar18 = stbi__get32le(s);
    if (((0x38 < sVar18) || ((0x100010000001000U >> ((ulong)sVar18 & 0x3f) & 1) == 0)) &&
       ((sVar18 != 0x7c && (sVar18 != 0x6c)))) goto LAB_0033ec6b;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    pvVar30 = stbi__bmp_parse_header(s,(stbi__bmp_data *)value);
    if (pvVar30 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar44 = s->img_y;
    uVar49 = -uVar44;
    if (0 < (int)uVar44) {
      uVar49 = uVar44;
    }
    s->img_y = uVar49;
    if ((0x1000000 < uVar49) || (0x1000000 < s->img_x)) goto LAB_0034188e;
    local_8908 = 0xff;
    if (iStack_88f0 == 0xc) {
      if (0x17 < (int)value) goto LAB_0034079e;
      uVar49 = ((iStack_88f4 - local_88d8) + -0x18) / 3;
LAB_003406db:
      if (uVar49 == 0) goto LAB_0034079e;
      bVar66 = false;
LAB_003406f2:
      bVar7 = uStack_88e0 == 0xff000000;
      iVar17 = 4 - (uint)(uStack_88e0 == 0);
      asVar23 = value;
    }
    else {
      if ((int)value < 0x10) {
        uVar49 = iStack_88f4 - (local_88d8 + iStack_88f0) >> 2;
        goto LAB_003406db;
      }
LAB_0034079e:
      iVar17 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read
      ;
      if (iVar17 - 0x401U < 0xfffffc00) {
        lVar47 = *in_FS_OFFSET;
        pcVar40 = "bad header";
        goto LAB_00342722;
      }
      if ((iStack_88f4 < iVar17) || (0x400 < iStack_88f4 - iVar17)) {
        lVar47 = *in_FS_OFFSET;
        pcVar40 = "bad offset";
        goto LAB_00342722;
      }
      stbi__skip(s,iStack_88f4 - iVar17);
      uVar49 = 0;
      bVar66 = true;
      if (value != (stbi_uc  [4])0x18 || uStack_88e0 != 0xff000000) goto LAB_003406f2;
      bVar7 = true;
      iVar17 = 3;
      asVar23[0] = '\x18';
      asVar23[1] = '\0';
      asVar23[2] = '\0';
      asVar23[3] = '\0';
      bVar66 = true;
    }
    s->img_n = iVar17;
    sVar18 = s->img_x;
    sVar21 = s->img_y;
    iVar17 = stbi__mad3sizes_valid(4,sVar18,sVar21,0);
    if (iVar17 == 0) goto LAB_0034188e;
    pvVar30 = stbi__malloc_mad3(4,sVar18,sVar21,0);
    if (pvVar30 != (void *)0x0) {
      if ((int)asVar23 < 0x10) {
        if (!bVar66 && (int)uVar49 < 0x101) {
          uVar63 = 0;
          uVar52 = 0;
          if (0 < (int)uVar49) {
            uVar52 = (ulong)uVar49;
          }
          for (; uVar52 != uVar63; uVar63 = uVar63 + 1) {
            sVar9 = stbi__get8(s);
            pal[uVar63][2] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar63][1] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar63][0] = sVar9;
            if (iStack_88f0 != 0xc) {
              stbi__get8(s);
            }
            pal[uVar63][3] = 0xff;
          }
          stbi__skip(s,(uVar49 * (iStack_88f0 == 0xc | 0xfffffffc) + iStack_88f4) -
                       (iStack_88f0 + local_88d8));
          if (asVar23 == (stbi_uc  [4])0x1) {
            sVar21 = s->img_x;
            iVar17 = 0;
            lVar47 = 0;
LAB_00341c79:
            sVar18 = s->img_y;
            if (iVar17 < (int)sVar18) {
              bVar16 = stbi__get8(s);
              lVar47 = (long)(int)lVar47;
              iVar51 = 0;
              do {
                sVar18 = s->img_x;
                iVar54 = 8;
                do {
                  if ((int)sVar18 <= iVar51) {
LAB_00341cfb:
                    stbi__skip(s,-(sVar21 + 7 >> 3) & 3);
                    iVar17 = iVar17 + 1;
                    goto LAB_00341c79;
                  }
                  bVar66 = (bVar16 >> (iVar54 - 1U & 0x1f) & 1) != 0;
                  *(stbi_uc *)((long)pvVar30 + lVar47) = pal[bVar66][0];
                  *(stbi_uc *)((long)pvVar30 + lVar47 + 1) = pal[bVar66][1];
                  *(stbi_uc *)((long)pvVar30 + lVar47 + 2) = pal[bVar66][2];
                  *(undefined1 *)((long)pvVar30 + lVar47 + 3) = 0xff;
                  lVar47 = lVar47 + 4;
                  if (sVar18 - 1 == iVar51) goto LAB_00341cfb;
                  iVar51 = iVar51 + 1;
                  iVar56 = iVar54 + -1;
                  bVar66 = 0 < iVar54;
                  iVar54 = iVar56;
                } while (iVar56 != 0 && bVar66);
                bVar16 = stbi__get8(s);
              } while( true );
            }
          }
          else {
            if (asVar23 == (stbi_uc  [4])0x8) {
              uVar49 = s->img_x;
            }
            else {
              if (asVar23 != (stbi_uc  [4])0x4) {
                free(pvVar30);
                lVar47 = *in_FS_OFFSET;
                pcVar40 = "bad bpp";
                goto LAB_00342722;
              }
              uVar49 = s->img_x + 1 >> 1;
            }
            lVar47 = 0;
            local_8970._0_4_ = -uVar49 & 3;
            for (iVar17 = 0; sVar18 = s->img_y, iVar17 < (int)sVar18; iVar17 = iVar17 + 1) {
              lVar47 = (long)(int)lVar47 + 4;
              for (iVar51 = 0; iVar51 < (int)s->img_x; iVar51 = iVar51 + 2) {
                bVar15 = stbi__get8(s);
                bVar16 = bVar15 >> 4;
                if (asVar23 != (stbi_uc  [4])0x4) {
                  bVar16 = bVar15;
                }
                *(stbi_uc *)((long)pvVar30 + lVar47 + -4) = pal[bVar16][0];
                *(stbi_uc *)((long)pvVar30 + lVar47 + -3) = pal[bVar16][1];
                *(stbi_uc *)((long)pvVar30 + lVar47 + -2) = pal[bVar16][2];
                *(undefined1 *)((long)pvVar30 + lVar47 + -1) = 0xff;
                if (iVar51 + 1U == s->img_x) goto LAB_00341b66;
                uVar49 = bVar15 & 0xf;
                if (asVar23 != (stbi_uc  [4])0x4) {
                  uVar49 = 0;
                }
                if (asVar23 == (stbi_uc  [4])0x8) {
                  bVar16 = stbi__get8(s);
                  uVar49 = (uint)bVar16;
                }
                *(stbi_uc *)((long)pvVar30 + lVar47) = pal[uVar49][0];
                *(stbi_uc *)((long)pvVar30 + lVar47 + 1) = pal[uVar49][1];
                *(stbi_uc *)((long)pvVar30 + lVar47 + 2) = pal[uVar49][2];
                *(undefined1 *)((long)pvVar30 + lVar47 + 3) = 0xff;
                lVar47 = lVar47 + 8;
              }
              lVar47 = lVar47 + -4;
LAB_00341b66:
              stbi__skip(s,(uint)local_8970);
            }
          }
          goto LAB_00341b82;
        }
        free(pvVar30);
        lVar47 = *in_FS_OFFSET;
        pcVar40 = "invalid";
        goto LAB_00342722;
      }
      stbi__skip(s,iStack_88f4 - (iStack_88f0 + local_88d8));
      local_8908 = 0xff;
      if (asVar23 != (stbi_uc  [4])0x10) {
        if (asVar23 == (stbi_uc  [4])0x20) {
          local_88fc = 0;
          if ((bool)(bVar7 & (uStack_88ec == 0xff0000 &&
                             (local_88e8 == 0xff00 && uStack_88e4 == 0xff)))) {
            bVar66 = true;
            goto LAB_003414a2;
          }
          goto LAB_003414f3;
        }
        local_88fc = 0;
        if (asVar23 != (stbi_uc  [4])0x18) goto LAB_003414f3;
        local_88fc = s->img_x & 3;
        bVar66 = false;
LAB_003414a2:
        bVar7 = false;
        iVar17 = 0;
        iVar56 = 0;
        iVar51 = 0;
        iVar54 = 0;
        uVar49 = 0;
        uVar24 = 0;
        uVar25 = 0;
        local_88cc = 0;
LAB_003418fc:
        lVar47 = 0;
        for (iVar39 = 0; sVar18 = s->img_y, iVar39 < (int)sVar18; iVar39 = iVar39 + 1) {
          lVar47 = (long)(int)lVar47;
          if (bVar7) {
            for (iVar50 = 0; iVar50 < (int)s->img_x; iVar50 = iVar50 + 1) {
              if (asVar23 == (stbi_uc  [4])0x10) {
                uVar26 = stbi__get16le(s);
              }
              else {
                uVar26 = stbi__get32le(s);
              }
              iVar27 = stbi__shiftsigned(uVar26 & uStack_88ec,iVar17,uVar49);
              *(char *)((long)pvVar30 + lVar47) = (char)iVar27;
              iVar27 = stbi__shiftsigned(uVar26 & local_88e8,iVar56,uVar24);
              *(char *)((long)pvVar30 + lVar47 + 1) = (char)iVar27;
              iVar27 = stbi__shiftsigned(uVar26 & uStack_88e4,iVar51,uVar25);
              *(char *)((long)pvVar30 + lVar47 + 2) = (char)iVar27;
              if (uStack_88e0 == 0) {
                uVar26 = 0xff;
              }
              else {
                uVar26 = stbi__shiftsigned(uVar26 & uStack_88e0,iVar54,local_88cc);
              }
              local_8908 = local_8908 | uVar26;
              *(char *)((long)pvVar30 + lVar47 + 3) = (char)uVar26;
              lVar47 = lVar47 + 4;
            }
          }
          else {
            for (iVar50 = 0; iVar50 < (int)s->img_x; iVar50 = iVar50 + 1) {
              sVar9 = stbi__get8(s);
              *(stbi_uc *)((long)pvVar30 + lVar47 + 2) = sVar9;
              sVar9 = stbi__get8(s);
              *(stbi_uc *)((long)pvVar30 + lVar47 + 1) = sVar9;
              sVar9 = stbi__get8(s);
              *(stbi_uc *)((long)pvVar30 + lVar47) = sVar9;
              bVar16 = 0xff;
              if (bVar66) {
                bVar16 = stbi__get8(s);
              }
              local_8908 = local_8908 | bVar16;
              *(byte *)((long)pvVar30 + lVar47 + 3) = bVar16;
              lVar47 = lVar47 + 4;
            }
          }
          stbi__skip(s,local_88fc);
        }
LAB_00341b82:
        if (local_8908 == 0) {
          for (uVar49 = s->img_x * sVar18 * 4 - 1; -1 < (int)uVar49; uVar49 = uVar49 - 4) {
            *(undefined1 *)((long)pvVar30 + (ulong)uVar49) = 0xff;
          }
        }
        if (0 < (int)uVar44) {
          iVar17 = (int)sVar18 >> 1;
          if ((int)sVar18 >> 1 < 1) {
            iVar17 = 0;
          }
          iVar51 = sVar18 * 4;
          iVar54 = 0;
          for (iVar56 = 0; iVar51 = iVar51 + -4, iVar56 != iVar17; iVar56 = iVar56 + 1) {
            sVar18 = s->img_x;
            uVar52 = (ulong)(sVar18 * 4);
            if ((int)(sVar18 * 4) < 1) {
              uVar52 = 0;
            }
            for (uVar63 = 0; uVar52 != uVar63; uVar63 = uVar63 + 1) {
              uVar38 = *(undefined1 *)((long)pvVar30 + uVar63 + sVar18 * iVar54);
              *(undefined1 *)((long)pvVar30 + uVar63 + sVar18 * iVar54) =
                   *(undefined1 *)((long)pvVar30 + uVar63 + sVar18 * iVar51);
              *(undefined1 *)((long)pvVar30 + uVar63 + sVar18 * iVar51) = uVar38;
            }
            iVar54 = iVar54 + 4;
          }
        }
        *x = s->img_x;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return pvVar30;
        }
        return pvVar30;
      }
      local_88fc = s->img_x * 2 & 2;
LAB_003414f3:
      if ((local_88e8 != 0 && uStack_88ec != 0) && uStack_88e4 != 0) {
        iVar17 = stbi__high_bit(uStack_88ec);
        uVar49 = stbi__bitcount(uStack_88ec);
        iVar56 = stbi__high_bit(local_88e8);
        uVar24 = stbi__bitcount(local_88e8);
        iVar51 = stbi__high_bit(uStack_88e4);
        uVar25 = stbi__bitcount(uStack_88e4);
        iVar54 = stbi__high_bit(uStack_88e0);
        local_88cc = stbi__bitcount(uStack_88e0);
        if ((uVar25 < 9 && (uVar24 < 9 && uVar49 < 9)) && local_88cc < 9) {
          iVar17 = iVar17 + -7;
          iVar56 = iVar56 + -7;
          iVar51 = iVar51 + -7;
          iVar54 = iVar54 + -7;
          bVar7 = true;
          bVar66 = false;
          goto LAB_003418fc;
        }
      }
      free(pvVar30);
      lVar47 = *in_FS_OFFSET;
      pcVar40 = "bad masks";
      goto LAB_00342722;
    }
LAB_0034270f:
    lVar47 = *in_FS_OFFSET;
    pcVar40 = "outofmem";
    goto LAB_00342722;
  }
LAB_0033ec6b:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  sVar9 = stbi__get8(s);
  if (((((sVar9 == 'G') && (sVar9 = stbi__get8(s), sVar9 == 'I')) &&
       (sVar9 = stbi__get8(s), sVar9 == 'F')) && (sVar9 = stbi__get8(s), sVar9 == '8')) &&
     ((sVar9 = stbi__get8(s), sVar9 == '9' || (sVar9 == '7')))) {
    sVar9 = stbi__get8(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar9 == 'a') {
      memset((stbi__gif *)pal,0,0x8870);
      iVar17 = stbi__gif_header(s,(stbi__gif *)pal,comp,0);
      if (iVar17 == 0) goto LAB_003409ae;
      asVar23 = pal[0];
      asVar8 = pal[1];
      iVar17 = stbi__mad3sizes_valid(4,(int)pal[0],(int)pal[1],0);
      if (iVar17 == 0) {
        pcVar40 = "too large";
      }
      else {
        iVar17 = (int)asVar8 * (int)asVar23;
        __size = (size_t)(iVar17 * 4);
        pvVar30 = malloc(__size);
        pal._8_8_ = pvVar30;
        pvVar31 = malloc(__size);
        pal._16_8_ = pvVar31;
        __s = malloc((long)iVar17);
        pcVar40 = "outofmem";
        pal._24_8_ = __s;
        if ((pvVar30 != (void *)0x0) && (__s != (void *)0x0 && pvVar31 != (void *)0x0)) {
          memset(pvVar30,0,__size);
          memset(pvVar31,0,__size);
          local_8980 = pal + 0xd;
          uVar52 = (ulong)(uint)pal[0xb];
          memset(__s,0,(long)iVar17);
          while( true ) {
            sVar9 = stbi__get8(s);
            if (sVar9 != '!') break;
            sVar9 = stbi__get8(s);
            if (sVar9 == 0xf9) {
              bVar16 = stbi__get8(s);
              if (bVar16 == 4) {
                asVar19[0] = stbi__get8(s);
                asVar19[1] = '\0';
                asVar19[2] = '\0';
                asVar19[3] = '\0';
                pal[0xc] = asVar19;
                local_40 = stbi__get16le(s);
                local_40 = local_40 * 10;
                if (-1 < (int)(uint)uVar52) {
                  pal[uVar52 + 0xd][3] = 0xff;
                }
                if ((asVar19[0] & 1) == 0) {
                  stbi__skip(s,1);
                  pal[0xb][0] = 0xff;
                  pal[0xb][1] = 0xff;
                  pal[0xb][2] = 0xff;
                  pal[0xb][3] = 0xff;
                  uVar52 = 0xffffffff;
                }
                else {
                  bVar16 = stbi__get8(s);
                  uVar52 = (ulong)bVar16;
                  pal[0xb][1] = '\0';
                  pal[0xb][2] = '\0';
                  pal[0xb][3] = '\0';
                  pal[0xb][0] = bVar16;
                  pal[uVar52 + 0xd][3] = '\0';
                }
                goto LAB_0033eec2;
              }
              stbi__skip(s,(uint)bVar16);
            }
            else {
LAB_0033eec2:
              while (bVar16 = stbi__get8(s), bVar16 != 0) {
                stbi__skip(s,(uint)bVar16);
              }
            }
          }
          if (sVar9 == ';') goto LAB_003409ae;
          if (sVar9 == ',') {
            iVar17 = stbi__get16le(s);
            iVar51 = stbi__get16le(s);
            iVar54 = stbi__get16le(s);
            iVar56 = stbi__get16le(s);
            pcVar40 = "bad Image Descriptor";
            if ((iVar54 + iVar17 <= (int)asVar23) && (iVar56 + iVar51 <= (int)asVar8)) {
              iVar39 = (int)asVar23 * 4;
              local_5c = iVar17 << 2;
              local_58 = iVar51 * iVar39;
              local_54 = (iVar54 + iVar17) * 4;
              local_50 = (iVar56 + iVar51) * iVar39;
              local_48 = local_50;
              if (iVar54 != 0) {
                local_48 = local_58;
              }
              local_4c = local_5c;
              local_44 = iVar39;
              bVar16 = stbi__get8(s);
              local_60 = (uint)bVar16;
              local_64 = (int)asVar23 << 5;
              if ((bVar16 & 0x40) == 0) {
                local_64 = iVar39;
              }
              local_68 = (int)(local_60 << 0x19) >> 0x1f & 3;
              if ((char)bVar16 < '\0') {
                local_8980 = (stbi_uc (*) [4])local_8474;
                stbi__gif_parse_colortable
                          (s,local_8980,2 << (bVar16 & 7),
                           -(uint)(((uint)pal[0xc] & 1) == 0) | (uint)uVar52);
              }
              else if (((uint)pal[8] & 0x80) == 0) {
                pcVar40 = "missing color table";
                goto LAB_0034099b;
              }
              local_70 = local_8980;
              bVar16 = stbi__get8(s);
              if (bVar16 < 0xd) {
                uVar44 = 1 << (bVar16 & 0x1f);
                for (uVar52 = 0; uVar44 != uVar52; uVar52 = uVar52 + 1) {
                  *(undefined2 *)(auStack_8072 + uVar52 * 4 + -2) = 0xffff;
                  auStack_8072[uVar52 * 4] = (char)uVar52;
                  auStack_8072[uVar52 * 4 + 1] = (char)uVar52;
                }
                uVar28 = (2 << (bVar16 & 0x1f)) - 1;
                n = 0;
                iVar51 = 0;
                uVar24 = 0;
                bVar15 = 0;
                uVar25 = 0xffffffff;
                uVar26 = uVar44 + 2;
                iVar17 = bVar16 + 1;
                uVar49 = uVar28;
LAB_003423b6:
                do {
                  for (; uVar29 = uVar49, iVar54 = iVar17, uVar45 = uVar26, uVar55 = uVar25,
                      bVar11 = bVar15, iVar17 = iVar51 - iVar54, iVar51 < iVar54;
                      iVar51 = iVar51 + 8) {
                    if (n == 0) {
                      bVar15 = stbi__get8(s);
                      if (bVar15 == 0) goto LAB_0034251a;
                      n = (uint)bVar15;
                    }
                    n = n - 1;
                    bVar15 = stbi__get8(s);
                    bVar13 = (byte)iVar51;
                    uVar24 = uVar24 | (uint)bVar15 << (bVar13 & 0x1f);
                    bVar15 = bVar11;
                    uVar25 = uVar55;
                    uVar26 = uVar45;
                    iVar17 = iVar54;
                    uVar49 = uVar29;
                  }
                  uVar49 = (int)uVar24 >> ((byte)iVar54 & 0x1f);
                  uVar57 = uVar24 & uVar29;
                  iVar51 = iVar17;
                  uVar24 = uVar49;
                  bVar15 = 1;
                  uVar25 = 0xffffffff;
                  uVar26 = uVar44 + 2;
                  iVar17 = bVar16 + 1;
                  uVar49 = uVar28;
                } while (uVar57 == uVar44);
                if (uVar57 == uVar44 + 1) goto LAB_00342501;
                pcVar40 = "no clear code";
                if ((int)uVar45 < (int)uVar57) {
                  pcVar40 = "illegal code in raster";
                  goto LAB_0034099b;
                }
                if ((bool)(bVar11 ^ 1)) goto LAB_0034099b;
                if ((int)uVar55 < 0) {
                  if (uVar57 == uVar45) goto LAB_003426a8;
                }
                else {
                  if (0x1fff < (int)uVar45) {
                    pcVar40 = "too many codes";
                    goto LAB_0034099b;
                  }
                  lVar47 = (long)(int)uVar45;
                  uVar45 = uVar45 + 1;
                  *(short *)(auStack_8072 + lVar47 * 4 + -2) = (short)uVar55;
                  uVar38 = auStack_8072[(ulong)uVar55 * 4];
                  auStack_8072[lVar47 * 4] = uVar38;
                  if (uVar57 != uVar45) {
                    uVar38 = auStack_8072[(long)(int)uVar57 * 4];
                  }
                  auStack_8072[lVar47 * 4 + 1] = uVar38;
                }
                stbi__out_gif_code((stbi__gif *)pal,(stbi__uint16)uVar57);
                iVar17 = iVar54 + 1;
                uVar49 = ~(-1 << ((byte)iVar17 & 0x1f));
                if (0xfff < (int)uVar45 || (uVar45 & uVar29) != 0) {
                  uVar49 = uVar29;
                  iVar17 = iVar54;
                }
                bVar15 = 1;
                uVar25 = uVar57;
                uVar26 = uVar45;
                goto LAB_003423b6;
              }
              goto LAB_003409ae;
            }
          }
          else {
            pcVar40 = "unknown code";
          }
        }
      }
LAB_0034099b:
      *(char **)(*in_FS_OFFSET + -8) = pcVar40;
      goto LAB_003409ae;
    }
  }
  else {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  sVar18 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar18 == 0x38425053) {
    sVar18 = stbi__get32be(s);
    if (sVar18 != 0x38425053) {
      lVar47 = *in_FS_OFFSET;
      pcVar40 = "not PSD";
      goto LAB_00342722;
    }
    iVar17 = stbi__get16be(s);
    if (iVar17 != 1) {
      lVar47 = *in_FS_OFFSET;
      pcVar40 = "wrong version";
      goto LAB_00342722;
    }
    stbi__skip(s,6);
    uVar44 = stbi__get16be(s);
    if (0x10 < uVar44) {
      lVar47 = *in_FS_OFFSET;
      pcVar40 = "wrong channel count";
      goto LAB_00342722;
    }
    sVar18 = stbi__get32be(s);
    sVar21 = stbi__get32be(s);
    if (((int)sVar18 < 0x1000001) && ((int)sVar21 < 0x1000001)) {
      iVar17 = stbi__get16be(s);
      if ((iVar17 != 8) && (iVar17 != 0x10)) {
        lVar47 = *in_FS_OFFSET;
        pcVar40 = "unsupported bit depth";
        goto LAB_00342722;
      }
      iVar51 = stbi__get16be(s);
      if (iVar51 != 3) {
        lVar47 = *in_FS_OFFSET;
        pcVar40 = "wrong color format";
        goto LAB_00342722;
      }
      sVar22 = stbi__get32be(s);
      stbi__skip(s,sVar22);
      sVar22 = stbi__get32be(s);
      stbi__skip(s,sVar22);
      sVar22 = stbi__get32be(s);
      stbi__skip(s,sVar22);
      uVar49 = stbi__get16be(s);
      if (1 < uVar49) {
        lVar47 = *in_FS_OFFSET;
        pcVar40 = "bad compression";
        goto LAB_00342722;
      }
      iVar51 = stbi__mad3sizes_valid(4,sVar21,sVar18,0);
      if (iVar51 != 0) {
        if ((((int)ri == 0x10) && (iVar17 == 0x10)) && (uVar49 == 0)) {
          pvVar30 = stbi__malloc_mad3(8,sVar21,sVar18,0);
          *piVar59 = 0x10;
        }
        else {
          pvVar30 = malloc((long)(int)(sVar18 * sVar21 * 4));
        }
        if (pvVar30 != (void *)0x0) {
          uVar24 = sVar21 * sVar18;
          if (uVar49 == 0) {
            uVar52 = 0;
            pvVar31 = pvVar30;
            local_8980 = (stbi_uc (*) [4])pvVar30;
            uVar49 = 0;
            if (0 < (int)uVar24) {
              uVar49 = uVar24;
            }
            for (; uVar52 != 4; uVar52 = uVar52 + 1) {
              if (uVar52 < uVar44) {
                if (*piVar59 == 0x10) {
                  for (lVar47 = 0; uVar49 != (uint)lVar47; lVar47 = lVar47 + 1) {
                    iVar51 = stbi__get16be(s);
                    *(short *)((long)local_8980 + lVar47 * 8) = (short)iVar51;
                  }
                }
                else {
                  lVar47 = 0;
                  if (iVar17 == 0x10) {
                    for (; uVar49 != (uint)lVar47; lVar47 = lVar47 + 1) {
                      iVar51 = stbi__get16be(s);
                      *(char *)((long)pvVar31 + lVar47 * 4) = (char)((uint)iVar51 >> 8);
                    }
                  }
                  else {
                    for (; uVar49 != (uint)lVar47; lVar47 = lVar47 + 1) {
                      sVar9 = stbi__get8(s);
                      *(stbi_uc *)((long)pvVar31 + lVar47 * 4) = sVar9;
                    }
                  }
                }
              }
              else if (iVar17 == 0x10 && (int)ri == 0x10) {
                for (lVar47 = 0; uVar49 != (uint)lVar47; lVar47 = lVar47 + 1) {
                  *(ushort *)((long)local_8980 + lVar47 * 8) = -(ushort)(uVar52 == 3);
                }
              }
              else {
                for (lVar47 = 0; uVar49 != (uint)lVar47; lVar47 = lVar47 + 1) {
                  *(char *)((long)pvVar31 + lVar47 * 4) = -(uVar52 == 3);
                }
              }
              pvVar31 = (void *)((long)pvVar31 + 1);
              local_8980 = (stbi_uc (*) [4])((long)local_8980 + 2);
            }
          }
          else {
            stbi__skip(s,sVar18 * uVar44 * 2);
            uVar52 = 0;
            pvVar31 = pvVar30;
            uVar49 = 0;
            if (0 < (int)uVar24) {
              uVar49 = uVar24;
            }
            for (; uVar52 != 4; uVar52 = uVar52 + 1) {
              if (uVar52 < uVar44) {
                psVar64 = (stbi_uc *)((long)pvVar30 + uVar52);
                iVar17 = 0;
                do {
                  uVar25 = uVar24 - iVar17;
                  do {
                    if ((int)uVar25 < 1) goto LAB_00341736;
                    bVar16 = stbi__get8(s);
                  } while (bVar16 == 0x80);
                  uVar26 = (uint)bVar16;
                  if ((char)bVar16 < '\0') {
                    uVar28 = 0x101 - uVar26;
                    if (uVar25 < uVar28) goto LAB_0034205c;
                    sVar9 = stbi__get8(s);
                    for (iVar51 = uVar26 - 0x101; iVar51 != 0; iVar51 = iVar51 + 1) {
                      *psVar64 = sVar9;
                      psVar64 = psVar64 + 4;
                    }
                  }
                  else {
                    if (uVar25 <= bVar16) {
LAB_0034205c:
                      free(pvVar30);
                      lVar47 = *in_FS_OFFSET;
                      pcVar40 = "corrupt";
                      goto LAB_00342722;
                    }
                    uVar28 = uVar26 + 1;
                    uVar25 = uVar28;
                    while (bVar66 = uVar25 != 0, uVar25 = uVar25 - 1, bVar66) {
                      sVar9 = stbi__get8(s);
                      *psVar64 = sVar9;
                      psVar64 = psVar64 + 4;
                    }
                  }
                  iVar17 = iVar17 + uVar28;
                } while( true );
              }
              for (lVar47 = 0; uVar49 != (uint)lVar47; lVar47 = lVar47 + 1) {
                *(char *)((long)pvVar31 + lVar47 * 4) = -(uVar52 == 3);
              }
LAB_00341736:
              pvVar31 = (void *)((long)pvVar31 + 1);
            }
          }
          if (3 < uVar44) {
            uVar52 = 0;
            if (0 < (int)uVar24) {
              uVar52 = (ulong)uVar24;
            }
            if (*piVar59 == 0x10) {
              for (uVar63 = 0; uVar52 != uVar63; uVar63 = uVar63 + 1) {
                uVar4 = *(ushort *)((long)pvVar30 + uVar63 * 8 + 6);
                if ((uVar4 != 0) && (uVar4 != 0xffff)) {
                  fVar68 = 1.0 / ((float)uVar4 / 65535.0);
                  fVar67 = (1.0 - fVar68) * 65535.0;
                  uVar44 = *(uint *)((long)pvVar30 + uVar63 * 8);
                  auVar69._0_4_ = (int)(fVar67 + fVar68 * (float)(uVar44 & 0xffff));
                  auVar69._4_4_ = (int)(fVar67 + fVar68 * (float)(uVar44 >> 0x10));
                  auVar69._8_4_ = (int)(fVar67 + fVar68 * 0.0);
                  auVar69._12_4_ = (int)(fVar67 + fVar68 * 0.0);
                  auVar69 = pshuflw(auVar69,auVar69,0xe8);
                  *(int *)((long)pvVar30 + uVar63 * 8) = auVar69._0_4_;
                  *(short *)((long)pvVar30 + uVar63 * 8 + 4) =
                       (short)(int)((float)*(ushort *)((long)pvVar30 + uVar63 * 8 + 4) * fVar68 +
                                   fVar67);
                }
              }
            }
            else {
              for (uVar63 = 0; uVar52 != uVar63; uVar63 = uVar63 + 1) {
                bVar16 = *(byte *)((long)pvVar30 + uVar63 * 4 + 3);
                if ((bVar16 != 0) && (bVar16 != 0xff)) {
                  fVar68 = 1.0 / ((float)bVar16 / 255.0);
                  fVar67 = (1.0 - fVar68) * 255.0;
                  *(char *)((long)pvVar30 + uVar63 * 4) =
                       (char)(int)((float)*(byte *)((long)pvVar30 + uVar63 * 4) * fVar68 + fVar67);
                  *(char *)((long)pvVar30 + uVar63 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)pvVar30 + uVar63 * 4 + 1) * fVar68 +
                                  fVar67);
                  *(char *)((long)pvVar30 + uVar63 * 4 + 2) =
                       (char)(int)((float)*(byte *)((long)pvVar30 + uVar63 * 4 + 2) * fVar68 +
                                  fVar67);
                }
              }
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar18;
          *x = sVar21;
          return pvVar30;
        }
        goto LAB_0034270f;
      }
    }
  }
  else {
    iVar17 = stbi__pic_is4(s,anon_var_dwarf_e8f3fc);
    if (iVar17 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar17 = 0x54;
      while (bVar66 = iVar17 != 0, iVar17 = iVar17 + -1, bVar66) {
        stbi__get8(s);
      }
      iVar17 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar17 != 0) {
        iVar17 = 0x5c;
        while (bVar66 = iVar17 != 0, iVar17 = iVar17 + -1, bVar66) {
          stbi__get8(s);
        }
        uVar44 = stbi__get16be(s);
        uVar49 = stbi__get16be(s);
        iVar17 = stbi__at_eof(s);
        if (iVar17 != 0) {
          lVar47 = *in_FS_OFFSET;
          pcVar40 = "bad file";
          goto LAB_00342722;
        }
        iVar17 = stbi__mad3sizes_valid(uVar44,uVar49,4,0);
        if (iVar17 != 0) {
          stbi__get32be(s);
          stbi__get16be(s);
          stbi__get16be(s);
          pvVar30 = stbi__malloc_mad3(uVar44,uVar49,4,0);
          if (pvVar30 != (void *)0x0) {
            bVar16 = 0;
            memset(pvVar30,0xff,(ulong)(uVar44 * 4 * uVar49));
            psVar64 = pal[0] + 2;
            lVar47 = 0;
            do {
              if (lVar47 == 10) {
LAB_00340834:
                lVar47 = *in_FS_OFFSET;
                pcVar40 = "bad format";
                goto LAB_00340930;
              }
              sVar9 = stbi__get8(s);
              bVar15 = stbi__get8(s);
              (*(stbi_uc (*) [4])(psVar64 + -2))[0] = bVar15;
              bVar11 = stbi__get8(s);
              psVar64[-1] = bVar11;
              bVar11 = stbi__get8(s);
              *psVar64 = bVar11;
              iVar17 = stbi__at_eof(s);
              if (iVar17 != 0) goto LAB_0034091d;
              if (bVar15 != 8) goto LAB_00340834;
              bVar16 = bVar16 | bVar11;
              psVar64 = psVar64 + 3;
              lVar47 = lVar47 + 1;
            } while (sVar9 != '\0');
            if (comp != (int *)0x0) {
              *comp = 4 - (uint)((bVar16 & 0x10) == 0);
            }
            for (uVar52 = 0; uVar52 != uVar49; uVar52 = uVar52 + 1) {
              psVar64 = (stbi_uc *)((long)pvVar30 + (long)(int)(uVar44 * 4 * (int)uVar52));
              for (lVar35 = 0; lVar47 != lVar35; lVar35 = lVar35 + 1) {
                lVar5 = lVar35 * 3;
                sVar9 = pal[0][lVar5 + 1];
                psVar65 = psVar64;
                uVar24 = uVar44;
                if (sVar9 == '\0') {
                  while (bVar66 = uVar24 != 0, uVar24 = uVar24 - 1, bVar66) {
                    psVar34 = stbi__readval(s,(uint)pal[0][lVar5 + 2],psVar65);
                    if (psVar34 == (stbi_uc *)0x0) goto LAB_00340941;
                    psVar65 = psVar65 + 4;
                  }
                }
                else if (sVar9 == '\x01') {
                  for (; 0 < (int)uVar24; uVar24 = uVar24 - (uVar25 & 0xff)) {
                    bVar16 = stbi__get8(s);
                    iVar17 = stbi__at_eof(s);
                    if (iVar17 != 0) goto LAB_0034091d;
                    psVar34 = stbi__readval(s,(uint)pal[0][lVar5 + 2],value);
                    if (psVar34 == (stbi_uc *)0x0) goto LAB_00340941;
                    uVar25 = (uint)bVar16;
                    if (uVar24 < bVar16) {
                      uVar25 = uVar24;
                    }
                    uVar26 = uVar25 & 0xff;
                    while (bVar66 = uVar26 != 0, uVar26 = uVar26 - 1, bVar66) {
                      stbi__copyval((uint)pal[0][lVar5 + 2],psVar65,value);
                      psVar65 = psVar65 + 4;
                    }
                  }
                }
                else {
                  if (sVar9 != '\x02') {
                    lVar47 = *in_FS_OFFSET;
                    pcVar40 = "bad format";
LAB_003420b0:
                    *(char **)(lVar47 + -8) = pcVar40;
                    goto LAB_00340941;
                  }
                  for (; 0 < (int)uVar24; uVar24 = uVar24 - iVar17) {
                    bVar16 = stbi__get8(s);
                    iVar17 = stbi__at_eof(s);
                    if (iVar17 != 0) {
LAB_00341f06:
                      lVar47 = *in_FS_OFFSET;
                      pcVar40 = "bad file";
                      goto LAB_003420b0;
                    }
                    uVar25 = (uint)bVar16;
                    if ((char)bVar16 < '\0') {
                      if (uVar25 == 0x80) {
                        iVar17 = stbi__get16be(s);
                      }
                      else {
                        iVar17 = uVar25 - 0x7f;
                      }
                      if ((int)uVar24 < iVar17) goto LAB_00341f06;
                      psVar34 = stbi__readval(s,(uint)pal[0][lVar5 + 2],value);
                      iVar51 = iVar17;
                      if (psVar34 == (stbi_uc *)0x0) goto LAB_00340941;
                      while (iVar51 != 0) {
                        stbi__copyval((uint)pal[0][lVar5 + 2],psVar65,value);
                        psVar65 = psVar65 + 4;
                        iVar51 = iVar51 + -1;
                      }
                    }
                    else {
                      iVar17 = bVar16 + 1;
                      iVar51 = iVar17;
                      if (uVar24 <= uVar25) {
                        *(char **)(*in_FS_OFFSET + -8) = "bad file";
                        goto LAB_00340941;
                      }
                      while (bVar66 = iVar51 != 0, iVar51 = iVar51 + -1, bVar66) {
                        psVar34 = stbi__readval(s,(uint)pal[0][lVar5 + 2],psVar65);
                        if (psVar34 == (stbi_uc *)0x0) goto LAB_00340941;
                        psVar65 = psVar65 + 4;
                      }
                    }
                  }
                }
              }
            }
LAB_00340950:
            *x = uVar44;
            *y = uVar49;
            return pvVar30;
          }
          goto LAB_0034270f;
        }
        goto LAB_0034188e;
      }
    }
    psVar33 = (stbi__jpeg *)calloc(1,0x4888);
    if (psVar33 == (stbi__jpeg *)0x0) {
      *(char **)(*in_FS_OFFSET + -8) = "outofmem";
    }
    else {
      psVar33->s = s;
      psVar33->idct_block_kernel = stbi__idct_simd;
      psVar33->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar33->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      iVar17 = stbi__decode_jpeg_header(psVar33,1);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      free(psVar33);
      if (iVar17 != 0) {
        psVar33 = (stbi__jpeg *)calloc(1,0x4888);
        if (psVar33 == (stbi__jpeg *)0x0) goto LAB_0034270f;
        psVar33->s = s;
        psVar33->idct_block_kernel = stbi__idct_simd;
        psVar33->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
        psVar33->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
        s->img_n = 0;
        for (lVar47 = 0x46d8; lVar47 != 0x4858; lVar47 = lVar47 + 0x60) {
          psVar64 = psVar33->huff_dc[0].fast + lVar47 + -8;
          psVar64[0] = '\0';
          psVar64[1] = '\0';
          psVar64[2] = '\0';
          psVar64[3] = '\0';
          psVar64[4] = '\0';
          psVar64[5] = '\0';
          psVar64[6] = '\0';
          psVar64[7] = '\0';
          psVar64[8] = '\0';
          psVar64[9] = '\0';
          psVar64[10] = '\0';
          psVar64[0xb] = '\0';
          psVar64[0xc] = '\0';
          psVar64[0xd] = '\0';
          psVar64[0xe] = '\0';
          psVar64[0xf] = '\0';
        }
        psVar33->restart_interval = 0;
        iVar17 = stbi__decode_jpeg_header(psVar33,0);
        if (iVar17 == 0) {
LAB_0034144e:
          stbi__cleanup_jpeg(psVar33);
        }
        else {
          paVar1 = psVar33->img_comp;
          bVar16 = stbi__get_marker(psVar33);
          while (bVar16 == 0xda) {
            iVar17 = stbi__get16be(psVar33->s);
            bVar16 = stbi__get8(psVar33->s);
            uVar44 = (uint)bVar16;
            psVar33->scan_n = (uint)bVar16;
            if (((byte)(bVar16 - 5) < 0xfc) ||
               (psVar46 = psVar33->s, psVar46->img_n < (int)(uint)bVar16)) {
              pcVar40 = "bad SOS component count";
              goto LAB_00341433;
            }
            if (iVar17 != (uint)bVar16 * 2 + 6) {
              pcVar40 = "bad SOS len";
              goto LAB_00341433;
            }
            lVar47 = 0;
            while( true ) {
              bVar16 = stbi__get8(psVar46);
              if ((int)uVar44 <= lVar47) break;
              bVar15 = stbi__get8(psVar33->s);
              psVar46 = psVar33->s;
              uVar44 = psVar46->img_n;
              uVar52 = 0;
              if (0 < (int)uVar44) {
                uVar52 = (ulong)uVar44;
              }
              paVar60 = paVar1;
              for (uVar63 = 0; uVar52 != uVar63; uVar63 = uVar63 + 1) {
                if (paVar60->id == (uint)bVar16) {
                  uVar52 = uVar63 & 0xffffffff;
                  break;
                }
                paVar60 = paVar60 + 1;
              }
              if ((uint)uVar52 == uVar44) goto LAB_0034144e;
              psVar33->img_comp[uVar52].hd = (uint)(bVar15 >> 4);
              if (0x3f < bVar15) {
                pcVar40 = "bad DC huff";
                goto LAB_00341433;
              }
              paVar1[uVar52].ha = bVar15 & 0xf;
              if (3 < (bVar15 & 0xf)) {
                pcVar40 = "bad AC huff";
                goto LAB_00341433;
              }
              psVar33->order[lVar47] = (uint)uVar52;
              lVar47 = lVar47 + 1;
              uVar44 = psVar33->scan_n;
            }
            psVar33->spec_start = (uint)bVar16;
            bVar16 = stbi__get8(psVar33->s);
            psVar33->spec_end = (uint)bVar16;
            bVar16 = stbi__get8(psVar33->s);
            psVar33->succ_high = (uint)(bVar16 >> 4);
            psVar33->succ_low = bVar16 & 0xf;
            iVar17 = psVar33->spec_start;
            if (psVar33->progressive == 0) {
              if ((iVar17 != 0) || ((0xf < bVar16 || ((bVar16 & 0xf) != 0)))) {
LAB_0034142c:
                pcVar40 = "bad SOS";
                goto LAB_00341433;
              }
              psVar33->spec_end = 0x3f;
            }
            else if ((((0x3f < iVar17) || (0x3f < psVar33->spec_end)) ||
                     (psVar33->spec_end < iVar17)) || ((0xdf < bVar16 || (0xd < (bVar16 & 0xf)))))
            goto LAB_0034142c;
            stbi__jpeg_reset(psVar33);
            if (psVar33->progressive == 0) {
              if (psVar33->scan_n == 1) {
                iVar17 = psVar33->order[0];
                uVar44 = psVar33->img_comp[iVar17].x + 7 >> 3;
                iVar51 = psVar33->img_comp[iVar17].y + 7 >> 3;
                if ((int)uVar44 < 1) {
                  uVar44 = 0;
                }
                iVar54 = 0;
                if (iVar51 < 1) {
                  iVar51 = 0;
                }
                for (iVar56 = 0; iVar56 != iVar51; iVar56 = iVar56 + 1) {
                  for (lVar47 = 0; (ulong)uVar44 * 8 != lVar47; lVar47 = lVar47 + 8) {
                    iVar39 = stbi__jpeg_decode_block
                                       (psVar33,(short *)pal,
                                        (stbi__huffman *)psVar33->huff_dc[paVar1[iVar17].hd].fast,
                                        (stbi__huffman *)psVar33->huff_ac[paVar1[iVar17].ha].fast,
                                        psVar33->fast_ac[paVar1[iVar17].ha],iVar17,
                                        psVar33->dequant[paVar1[iVar17].tq]);
                    if (iVar39 == 0) {
                      bVar66 = false;
                      goto LAB_0033fea3;
                    }
                    (*psVar33->idct_block_kernel)
                              (paVar1[iVar17].data + lVar47 + iVar54 * paVar1[iVar17].w2,
                               paVar1[iVar17].w2,(short *)pal);
                    iVar39 = psVar33->todo;
                    psVar33->todo = iVar39 + -1;
                    if (iVar39 < 2) {
                      if (psVar33->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar33);
                      }
                      if ((psVar33->marker & 0xf8) != 0xd0) goto LAB_0033fea0;
                      stbi__jpeg_reset(psVar33);
                    }
                  }
                  iVar54 = iVar54 + 8;
                }
LAB_0033fea0:
                bVar66 = true;
              }
              else {
                for (iVar17 = 0; iVar17 < psVar33->img_mcu_y; iVar17 = iVar17 + 1) {
                  for (iVar51 = 0; iVar51 < psVar33->img_mcu_x; iVar51 = iVar51 + 1) {
                    for (lVar47 = 0; lVar47 < psVar33->scan_n; lVar47 = lVar47 + 1) {
                      iVar54 = psVar33->order[lVar47];
                      for (iVar56 = 0; iVar56 < paVar1[iVar54].v; iVar56 = iVar56 + 1) {
                        for (iVar39 = 0; iVar50 = paVar1[iVar54].h, iVar39 < iVar50;
                            iVar39 = iVar39 + 1) {
                          iVar27 = paVar1[iVar54].v;
                          iVar20 = stbi__jpeg_decode_block
                                             (psVar33,(short *)pal,
                                              (stbi__huffman *)
                                              psVar33->huff_dc[paVar1[iVar54].hd].fast,
                                              (stbi__huffman *)
                                              psVar33->huff_ac[paVar1[iVar54].ha].fast,
                                              psVar33->fast_ac[paVar1[iVar54].ha],iVar54,
                                              psVar33->dequant[paVar1[iVar54].tq]);
                          if (iVar20 == 0) {
                            bVar66 = false;
                            goto LAB_0033fea3;
                          }
                          (*psVar33->idct_block_kernel)
                                    (paVar1[iVar54].data +
                                     (long)((iVar50 * iVar51 + iVar39) * 8) +
                                     (long)((iVar27 * iVar17 + iVar56) * paVar1[iVar54].w2 * 8),
                                     paVar1[iVar54].w2,(short *)pal);
                        }
                      }
                    }
                    iVar54 = psVar33->todo;
                    psVar33->todo = iVar54 + -1;
                    if (iVar54 < 2) {
                      if (psVar33->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar33);
                      }
                      if ((psVar33->marker & 0xf8) != 0xd0) goto LAB_0033ff2c;
                      stbi__jpeg_reset(psVar33);
                    }
                  }
                }
LAB_0033ff2c:
                bVar66 = true;
              }
LAB_0033fea3:
              if (bVar66) goto LAB_0033feab;
              goto LAB_0034144e;
            }
            if (psVar33->scan_n == 1) {
              iVar17 = psVar33->order[0];
              iVar54 = psVar33->img_comp[iVar17].x + 7 >> 3;
              iVar51 = psVar33->img_comp[iVar17].y + 7 >> 3;
              iVar56 = 0;
              if (iVar54 < 1) {
                iVar54 = 0;
              }
              if (iVar51 < 1) {
                iVar51 = iVar56;
              }
              for (; iVar56 != iVar51; iVar56 = iVar56 + 1) {
                for (iVar39 = 0; iVar39 != iVar54; iVar39 = iVar39 + 1) {
                  psVar62 = paVar1[iVar17].coeff + (paVar1[iVar17].coeff_w * iVar56 + iVar39) * 0x40
                  ;
                  uVar52 = (ulong)psVar33->spec_start;
                  if (uVar52 == 0) {
                    iVar50 = stbi__jpeg_decode_block_prog_dc
                                       (psVar33,psVar62,
                                        (stbi__huffman *)psVar33->huff_dc[paVar1[iVar17].hd].fast,
                                        iVar17);
                    if (iVar50 == 0) goto LAB_0034144e;
                  }
                  else {
                    iVar50 = paVar1[iVar17].ha;
                    psVar64 = psVar33->huff_ac[iVar50].fast;
                    iVar27 = psVar33->eob_run;
                    bVar16 = (byte)psVar33->succ_low;
                    if (psVar33->succ_high == 0) {
                      if (iVar27 == 0) {
                        do {
                          if (psVar33->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(psVar33);
                          }
                          sVar43 = psVar33->fast_ac[iVar50][psVar33->code_buffer >> 0x17];
                          uVar44 = (uint)sVar43;
                          iVar27 = (int)uVar52;
                          if (sVar43 == 0) {
                            uVar44 = stbi__jpeg_huff_decode(psVar33,(stbi__huffman *)psVar64);
                            if ((int)uVar44 < 0) goto LAB_00340c21;
                            uVar49 = uVar44 >> 4;
                            if ((uVar44 & 0xf) == 0) {
                              if (uVar44 < 0xf0) {
                                iVar27 = 1 << ((byte)uVar49 & 0x1f);
                                psVar33->eob_run = iVar27;
                                if (0xf < uVar44) {
                                  iVar27 = stbi__jpeg_get_bits(psVar33,uVar49);
                                  iVar27 = iVar27 + psVar33->eob_run;
                                }
                                goto LAB_0033f798;
                              }
                              uVar52 = (ulong)(iVar27 + 0x10);
                            }
                            else {
                              lVar47 = (ulong)uVar49 + (long)iVar27;
                              uVar52 = (ulong)((int)lVar47 + 1);
                              bVar15 = ""[lVar47];
                              iVar27 = stbi__extend_receive(psVar33,uVar44 & 0xf);
                              psVar62[bVar15] = (short)(iVar27 << (bVar16 & 0x1f));
                            }
                          }
                          else {
                            uVar49 = uVar44 & 0xf;
                            if (psVar33->code_bits < (int)uVar49) goto LAB_00340c21;
                            lVar47 = (ulong)(uVar44 >> 4 & 0xf) + (long)iVar27;
                            psVar33->code_buffer = psVar33->code_buffer << (sbyte)uVar49;
                            psVar33->code_bits = psVar33->code_bits - uVar49;
                            uVar52 = (ulong)((int)lVar47 + 1);
                            psVar62[""[lVar47]] = (short)((uVar44 >> 8) << (bVar16 & 0x1f));
                          }
                        } while ((int)uVar52 <= psVar33->spec_end);
                      }
                      else {
LAB_0033f798:
                        psVar33->eob_run = iVar27 + -1;
                      }
                    }
                    else if (iVar27 == 0) {
                      iVar50 = 0x10000 << (bVar16 & 0x1f);
                      do {
                        uVar44 = stbi__jpeg_huff_decode(psVar33,(stbi__huffman *)psVar64);
                        if ((int)uVar44 < 0) goto LAB_00340c21;
                        uVar49 = uVar44 >> 4;
                        if ((uVar44 & 0xf) == 1) {
                          iVar27 = stbi__jpeg_get_bit(psVar33);
                          iVar20 = 1;
                          if (iVar27 == 0) {
                            iVar20 = 0xffff;
                          }
                          sVar43 = (short)(iVar20 << (bVar16 & 0x1f));
                        }
                        else {
                          if ((uVar44 & 0xf) != 0) goto LAB_00340c21;
                          if (uVar44 < 0xf0) {
                            psVar33->eob_run = ~(-1 << ((byte)uVar49 & 0x1f));
                            if (0xf < uVar44) {
                              iVar27 = stbi__jpeg_get_bits(psVar33,uVar49);
                              psVar33->eob_run = psVar33->eob_run + iVar27;
                            }
                            uVar49 = 0x40;
                          }
                          else {
                            uVar49 = 0xf;
                          }
                          sVar43 = 0;
                        }
                        uVar63 = (long)(int)uVar52;
                        do {
                          while( true ) {
                            uVar52 = uVar63;
                            iVar27 = psVar33->spec_end;
                            if ((long)iVar27 < (long)uVar52) goto LAB_0033f8cd;
                            bVar15 = ""[uVar52];
                            if (psVar62[bVar15] == 0) break;
                            iVar27 = stbi__jpeg_get_bit(psVar33);
                            if ((iVar27 != 0) &&
                               (sVar3 = psVar62[bVar15], (iVar50 >> 0x10 & (int)sVar3) == 0)) {
                              sVar6 = (short)((uint)iVar50 >> 0x10);
                              if (sVar3 < 1) {
                                sVar6 = -sVar6;
                              }
                              psVar62[bVar15] = sVar3 + sVar6;
                            }
                            uVar63 = uVar52 + 1;
                          }
                          bVar66 = uVar49 != 0;
                          uVar49 = uVar49 - 1;
                          uVar63 = uVar52 + 1;
                        } while (bVar66);
                        psVar62[bVar15] = sVar43;
                        uVar52 = uVar52 + 1;
LAB_0033f8cd:
                      } while ((int)uVar52 <= iVar27);
                    }
                    else {
                      psVar33->eob_run = iVar27 + -1;
                      uVar44 = (0x10000 << (bVar16 & 0x1f)) >> 0x10;
                      for (; (long)uVar52 <= (long)psVar33->spec_end; uVar52 = uVar52 + 1) {
                        bVar16 = ""[uVar52];
                        if (((psVar62[bVar16] != 0) &&
                            (iVar50 = stbi__jpeg_get_bit(psVar33), iVar50 != 0)) &&
                           (sVar43 = psVar62[bVar16], (uVar44 & (int)sVar43) == 0)) {
                          uVar49 = -uVar44;
                          if (0 < sVar43) {
                            uVar49 = uVar44;
                          }
                          psVar62[bVar16] = (short)uVar49 + sVar43;
                        }
                      }
                    }
                  }
                  iVar50 = psVar33->todo;
                  psVar33->todo = iVar50 + -1;
                  if (iVar50 < 2) {
                    if (psVar33->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar33);
                    }
                    bVar16 = psVar33->marker;
                    if ((bVar16 & 0xf8) != 0xd0) goto LAB_0033feb2;
                    stbi__jpeg_reset(psVar33);
                  }
                }
              }
            }
            else {
              for (iVar17 = 0; iVar17 < psVar33->img_mcu_y; iVar17 = iVar17 + 1) {
                for (iVar51 = 0; iVar51 < psVar33->img_mcu_x; iVar51 = iVar51 + 1) {
                  for (lVar47 = 0; lVar47 < psVar33->scan_n; lVar47 = lVar47 + 1) {
                    iVar54 = psVar33->order[lVar47];
                    for (iVar56 = 0; iVar56 < paVar1[iVar54].v; iVar56 = iVar56 + 1) {
                      iVar39 = 0;
                      while (iVar39 < paVar1[iVar54].h) {
                        iVar50 = stbi__jpeg_decode_block_prog_dc
                                           (psVar33,paVar1[iVar54].coeff +
                                                    (paVar1[iVar54].h * iVar51 + iVar39 +
                                                    (paVar1[iVar54].v * iVar17 + iVar56) *
                                                    paVar1[iVar54].coeff_w) * 0x40,
                                            (stbi__huffman *)
                                            psVar33->huff_dc[paVar1[iVar54].hd].fast,iVar54);
                        iVar39 = iVar39 + 1;
                        if (iVar50 == 0) goto LAB_0034144e;
                      }
                    }
                  }
                  iVar54 = psVar33->todo;
                  psVar33->todo = iVar54 + -1;
                  if (iVar54 < 2) {
                    if (psVar33->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar33);
                    }
                    bVar16 = psVar33->marker;
                    if ((bVar16 & 0xf8) != 0xd0) goto LAB_0033feb2;
                    stbi__jpeg_reset(psVar33);
                  }
                }
              }
            }
LAB_0033feab:
            bVar16 = psVar33->marker;
LAB_0033feb2:
            if (bVar16 == 0xff) {
              while (iVar17 = stbi__at_eof(psVar33->s), iVar17 == 0) {
                sVar9 = stbi__get8(psVar33->s);
                while (sVar9 == 0xff) {
                  iVar17 = stbi__at_eof(psVar33->s);
                  if (iVar17 != 0) goto LAB_0033ff00;
                  sVar9 = stbi__get8(psVar33->s);
                  if ((byte)(sVar9 - 1) < 0xfe) goto LAB_0033ff05;
                }
              }
LAB_0033ff00:
              sVar9 = 0xff;
LAB_0033ff05:
              psVar33->marker = sVar9;
            }
            bVar16 = stbi__get_marker(psVar33);
            if ((bVar16 & 0xf8) == 0xd0) {
LAB_0033f449:
              bVar16 = stbi__get_marker(psVar33);
            }
          }
          uVar44 = (uint)bVar16;
          if (uVar44 == 0xdc) {
            iVar17 = stbi__get16be(psVar33->s);
            sVar18 = stbi__get16be(psVar33->s);
            if (iVar17 == 4) {
              if (sVar18 == psVar33->s->img_y) goto LAB_0033f449;
              pcVar40 = "bad DNL height";
            }
            else {
              pcVar40 = "bad DNL len";
            }
            goto LAB_00341433;
          }
          if (uVar44 == 0xd9) {
            if (psVar33->progressive != 0) {
              for (lVar47 = 0; lVar47 < psVar33->s->img_n; lVar47 = lVar47 + 1) {
                uVar44 = psVar33->img_comp[lVar47].x + 7 >> 3;
                iVar17 = psVar33->img_comp[lVar47].y + 7 >> 3;
                iVar51 = 0;
                if ((int)uVar44 < 1) {
                  uVar44 = 0;
                }
                if (iVar17 < 1) {
                  iVar17 = 0;
                }
                for (; iVar51 != iVar17; iVar51 = iVar51 + 1) {
                  for (uVar52 = 0; uVar52 != uVar44; uVar52 = uVar52 + 1) {
                    psVar62 = paVar1[lVar47].coeff;
                    iVar56 = paVar1[lVar47].coeff_w * iVar51;
                    iVar54 = paVar1[lVar47].tq;
                    iVar39 = iVar56 + (int)uVar52;
                    for (lVar35 = 0; lVar35 != 0x40; lVar35 = lVar35 + 1) {
                      psVar62[iVar39 * 0x40 + lVar35] =
                           psVar62[iVar39 * 0x40 + lVar35] * psVar33->dequant[iVar54][lVar35];
                    }
                    (*psVar33->idct_block_kernel)
                              (paVar1[lVar47].data +
                               uVar52 * 8 + (long)(iVar51 * 8 * paVar1[lVar47].w2),paVar1[lVar47].w2
                               ,psVar62 + (iVar56 + (int)uVar52) * 0x40);
                  }
                }
              }
            }
          }
          else {
            iVar17 = stbi__process_marker(psVar33,uVar44);
            if (iVar17 != 0) goto LAB_0033f449;
          }
          psVar46 = psVar33->s;
          uVar44 = psVar46->img_n;
          if ((ulong)uVar44 == 3) {
            bVar66 = true;
            if (psVar33->rgb != 3) {
              if (psVar33->app14_color_transform != 0) goto LAB_00340f3e;
              bVar66 = psVar33->jfif == 0;
            }
          }
          else {
            if ((int)uVar44 < 1) goto LAB_0034144e;
LAB_00340f3e:
            bVar66 = false;
          }
          _value = (stbi_uc *)0x0;
          lVar47 = (ulong)uVar44 * 0x30;
          for (lVar35 = 0; lVar47 != lVar35; lVar35 = lVar35 + 0x30) {
            sVar18 = psVar46->img_x;
            pvVar30 = malloc((ulong)(sVar18 + 3));
            *(void **)((long)&psVar33->img_comp[0].linebuf + lVar35 * 2) = pvVar30;
            if (pvVar30 == (void *)0x0) {
              stbi__cleanup_jpeg(psVar33);
              lVar47 = *in_FS_OFFSET;
              goto LAB_00341a7c;
            }
            uVar52 = (long)psVar33->img_h_max /
                     (long)*(int *)((long)&psVar33->img_comp[0].h + lVar35 * 2);
            iVar17 = (int)uVar52;
            *(int *)(pal[6] + lVar35) = iVar17;
            iVar51 = psVar33->img_v_max / *(int *)((long)&psVar33->img_comp[0].v + lVar35 * 2);
            *(int *)(pal[7] + lVar35) = iVar51;
            *(int *)(pal[9] + lVar35) = iVar51 >> 1;
            *(int *)(pal[8] + lVar35) =
                 (int)((ulong)((sVar18 + iVar17) - 1) / (uVar52 & 0xffffffff));
            psVar64 = pal[10] + lVar35;
            psVar64[0] = '\0';
            psVar64[1] = '\0';
            psVar64[2] = '\0';
            psVar64[3] = '\0';
            uVar37 = *(undefined8 *)((long)&psVar33->img_comp[0].data + lVar35 * 2);
            *(undefined8 *)(pal[4] + lVar35) = uVar37;
            *(undefined8 *)(pal[2] + lVar35) = uVar37;
            if (iVar17 == 2) {
              pcVar36 = stbi__resample_row_h_2;
              if (iVar51 != 1) {
                if (iVar51 != 2) goto LAB_00341050;
                pcVar36 = psVar33->resample_row_hv_2_kernel;
              }
            }
            else if (iVar17 == 1) {
              pcVar36 = stbi__resample_row_generic;
              if (iVar51 == 2) {
                pcVar36 = stbi__resample_row_v_2;
              }
              if (iVar51 == 1) {
                pcVar36 = resample_row_1;
              }
            }
            else {
LAB_00341050:
              pcVar36 = stbi__resample_row_generic;
            }
            *(code **)(pal[0] + lVar35) = pcVar36;
          }
          sVar18 = psVar46->img_y;
          psVar32 = (stbi__uint16 *)stbi__malloc_mad3(4,psVar46->img_x,sVar18,1);
          if (psVar32 != (stbi__uint16 *)0x0) {
            iVar17 = 0;
            for (uVar44 = 0; uVar44 < sVar18; uVar44 = uVar44 + 1) {
              sVar18 = psVar46->img_x;
              psVar64 = value;
              for (lVar35 = 0; lVar47 != lVar35; lVar35 = lVar35 + 0x30) {
                iVar51 = *(int *)(pal[9] + lVar35);
                iVar54 = *(int *)(pal[7] + lVar35);
                iVar56 = iVar54 >> 1;
                psVar65 = pal[4] + lVar35;
                if (iVar51 < iVar56) {
                  psVar65 = pal[2] + lVar35;
                }
                psVar34 = pal[4] + lVar35;
                if (iVar56 <= iVar51) {
                  psVar34 = pal[2] + lVar35;
                }
                uVar37 = (**(code **)(pal[0] + lVar35))
                                   (*(undefined8 *)
                                     ((long)&psVar33->img_comp[0].linebuf + lVar35 * 2),
                                    *(undefined8 *)psVar65,*(undefined8 *)psVar34,
                                    *(undefined4 *)(pal[8] + lVar35),
                                    *(undefined4 *)(pal[6] + lVar35));
                *(undefined8 *)psVar64 = uVar37;
                *(int *)(pal[9] + lVar35) = iVar51 + 1;
                if (iVar54 <= iVar51 + 1) {
                  psVar65 = pal[9] + lVar35;
                  psVar65[0] = '\0';
                  psVar65[1] = '\0';
                  psVar65[2] = '\0';
                  psVar65[3] = '\0';
                  lVar5 = *(long *)(pal[4] + lVar35);
                  *(long *)(pal[2] + lVar35) = lVar5;
                  iVar51 = *(int *)(pal[10] + lVar35) + 1;
                  *(int *)(pal[10] + lVar35) = iVar51;
                  if (iVar51 < *(int *)((long)&psVar33->img_comp[0].y + lVar35 * 2)) {
                    *(long *)(pal[4] + lVar35) =
                         lVar5 + *(int *)((long)&psVar33->img_comp[0].w2 + lVar35 * 2);
                  }
                }
                psVar64 = psVar64 + 8;
              }
              psVar64 = (stbi_uc *)((long)psVar32 + (ulong)(uVar44 * 4 * sVar18));
              psVar46 = psVar33->s;
              if (psVar46->img_n == 3) {
                if (bVar66) {
                  uVar49 = sVar18 * iVar17;
                  for (puVar58 = (uchar *)0x0; puVar58 < (uchar *)(ulong)psVar46->img_x;
                      puVar58 = puVar58 + 1) {
                    *(stbi_uc *)((long)psVar32 + (long)puVar58 * 4 + (ulong)uVar49) =
                         _value[(long)puVar58];
                    *(uchar *)((long)psVar32 + (long)puVar58 * 4 + (ulong)uVar49 + 1) = *puVar58;
                    *(uchar *)((long)psVar32 + (long)puVar58 * 4 + (ulong)uVar49 + 2) = *puVar58;
                    *(uchar *)((long)psVar32 + (long)puVar58 * 4 + (ulong)uVar49 + 3) = 0xff;
                  }
                }
                else {
LAB_00341318:
                  (*psVar33->YCbCr_to_RGB_kernel)
                            (psVar64,_value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar46->img_x,4);
                }
              }
              else if (psVar46->img_n == 4) {
                if (psVar33->app14_color_transform == 2) {
                  (*psVar33->YCbCr_to_RGB_kernel)
                            (psVar64,_value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar46->img_x,4);
                  psVar46 = psVar33->s;
                  uVar49 = sVar18 * iVar17;
                  for (pbVar53 = (byte *)0x0; pbVar53 < (byte *)(ulong)psVar46->img_x;
                      pbVar53 = pbVar53 + 1) {
                    bVar16 = *pbVar53;
                    iVar51 = (*(byte *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49) ^ 0xff) *
                             (uint)bVar16;
                    *(uchar *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49) =
                         (uchar)((iVar51 + 0x80U >> 8) + iVar51 + 0x80 >> 8);
                    iVar51 = (*(byte *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49 + 1) ^
                             0xff) * (uint)bVar16;
                    *(uchar *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49 + 1) =
                         (uchar)(iVar51 + (iVar51 + 0x80U >> 8) + 0x80 >> 8);
                    iVar51 = (*(byte *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49 + 2) ^
                             0xff) * (uint)bVar16;
                    *(uchar *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49 + 2) =
                         (uchar)(iVar51 + (iVar51 + 0x80U >> 8) + 0x80 >> 8);
                  }
                }
                else {
                  if (psVar33->app14_color_transform != 0) goto LAB_00341318;
                  uVar49 = sVar18 * iVar17;
                  for (pbVar53 = (byte *)0x0; pbVar53 < (byte *)(ulong)psVar46->img_x;
                      pbVar53 = pbVar53 + 1) {
                    bVar16 = *pbVar53;
                    iVar51 = (uint)_value[(long)pbVar53] * (uint)bVar16;
                    *(uchar *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49) =
                         (uchar)((iVar51 + 0x80U >> 8) + iVar51 + 0x80 >> 8);
                    iVar51 = (uint)*pbVar53 * (uint)bVar16;
                    *(uchar *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49 + 1) =
                         (uchar)(iVar51 + (iVar51 + 0x80U >> 8) + 0x80 >> 8);
                    *(uchar *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49 + 2) =
                         (uchar)((uint)*pbVar53 * (uint)bVar16 +
                                 ((uint)*pbVar53 * (uint)bVar16 + 0x80 >> 8) + 0x80 >> 8);
                    *(uchar *)((long)psVar32 + (long)pbVar53 * 4 + (ulong)uVar49 + 3) = 0xff;
                  }
                }
              }
              else {
                uVar63 = (ulong)(sVar18 * iVar17);
                for (uVar52 = 0; uVar52 < psVar46->img_x; uVar52 = uVar52 + 1) {
                  uVar2 = _value[uVar52];
                  *(uchar *)((long)psVar32 + uVar52 * 4 + uVar63 + 2) = uVar2;
                  *(uchar *)((long)psVar32 + uVar52 * 4 + uVar63 + 1) = uVar2;
                  *(uchar *)((long)psVar32 + uVar52 * 4 + uVar63) = uVar2;
                  *(uchar *)((long)psVar32 + uVar52 * 4 + uVar63 + 3) = 0xff;
                }
              }
              psVar46 = psVar33->s;
              sVar18 = psVar46->img_y;
              iVar17 = iVar17 + 4;
            }
            stbi__cleanup_jpeg(psVar33);
            psVar46 = psVar33->s;
            *x = psVar46->img_x;
            *y = psVar46->img_y;
            if (comp != (int *)0x0) {
              *comp = (uint)(2 < psVar46->img_n) * 2 + 1;
            }
            goto LAB_0033f07f;
          }
          stbi__cleanup_jpeg(psVar33);
          lVar47 = *in_FS_OFFSET;
LAB_00341a7c:
          *(char **)(lVar47 + -8) = "outofmem";
        }
        psVar32 = (stbi__uint16 *)0x0;
        goto LAB_0033f07f;
      }
    }
    sVar9 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    uVar44 = (uint)piVar61;
    if ((sVar9 != 'P') || ((byte)(sVar10 - 0x37) < 0xfe)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar17 = stbi__hdr_test(s);
      if (iVar17 != 0) {
        stbi__hdr_gettoken(s,(char *)pal);
        iVar17 = bcmp(pal,"#?RADIANCE",0xb);
        if ((iVar17 != 0) && (iVar17 = bcmp(pal,"#?RGBE",7), iVar17 != 0)) {
          pcVar40 = "not HDR";
LAB_00340884:
          *(char **)(*in_FS_OFFSET + -8) = pcVar40;
          return (void *)0x0;
        }
        iVar17 = 1;
        bVar66 = false;
        while( true ) {
          stbi__hdr_gettoken(s,(char *)pal);
          iVar51 = (int)piVar61;
          if (pal[0][0] == '\0') break;
          iVar51 = bcmp(pal,"FORMAT=32-bit_rle_rgbe",0x17);
          if (iVar51 == 0) {
            bVar66 = true;
          }
        }
        if (!bVar66) {
          pcVar40 = "unsupported format";
          goto LAB_00340884;
        }
        stbi__hdr_gettoken(s,(char *)pal);
        iVar54 = bcmp(pal,"-Y ",3);
        pcVar40 = "unsupported data layout";
        if (iVar54 != 0) goto LAB_00340884;
        _value = pal[0] + 3;
        uVar52 = strtol((char *)_value,(char **)value,10);
        _value = _value + 2;
        do {
          psVar64 = _value;
          _value = psVar64 + 1;
        } while (psVar64[-2] == ' ');
        if (((psVar64[-2] != '+') || (psVar64[-1] != 'X')) || (*psVar64 != ' ')) goto LAB_00340884;
        uVar63 = strtol((char *)_value,(char **)0x0,10);
        pcVar40 = "too large";
        iVar54 = (int)uVar52;
        if ((0x1000000 < iVar54) || (uVar44 = (uint)uVar63, 0x1000000 < (int)uVar44))
        goto LAB_00340884;
        *x = uVar44;
        *y = iVar54;
        if (comp != (int *)0x0) {
          *comp = 3;
        }
        iVar56 = stbi__mad4sizes_valid(uVar44,iVar54,4,4,iVar51);
        pcVar40 = "too large";
        if (iVar56 == 0) goto LAB_00340884;
        psVar33 = (stbi__jpeg *)stbi__malloc_mad4(uVar44,iVar54,4,4,iVar51);
        if (psVar33 == (stbi__jpeg *)0x0) {
LAB_0034269c:
          pcVar40 = "outofmem";
          goto LAB_00340884;
        }
        iVar51 = 0;
        if (uVar44 - 0x8000 < 0xffff8008) goto LAB_0034272d;
        local_8960 = 0;
        uVar41 = 0;
        if (0 < iVar54) {
          uVar41 = uVar52 & 0xffffffff;
        }
        local_8970 = (void *)0x0;
        for (local_8968 = 0; local_8968 != uVar41; local_8968 = local_8968 + 1) {
          sVar9 = stbi__get8(s);
          sVar10 = stbi__get8(s);
          sVar12 = stbi__get8(s);
          if (((sVar9 != '\x02') || (sVar10 != '\x02')) || ((char)sVar12 < '\0')) {
            local_88b0 = sVar9;
            local_88af = sVar10;
            local_88ae = sVar12;
            local_88ad = stbi__get8(s);
            stbi__hdr_convert((float *)psVar33,&local_88b0,req_comp_00);
            free(local_8970);
            iVar51 = 0;
            do {
              stbi__getn(s,rgbe,4);
              stbi__hdr_convert((float *)(psVar33->huff_dc[0].fast +
                                         (long)(iVar17 * 4) * 4 +
                                         (long)(int)(uVar44 * iVar51 * 4) * 4 + -8),rgbe,req_comp_01
                               );
              iVar17 = iVar17 + 1;
              while ((int)uVar44 <= iVar17) {
                iVar51 = iVar51 + 1;
LAB_0034272d:
                iVar17 = 0;
                if (iVar54 <= iVar51) goto LAB_0034273b;
              }
            } while( true );
          }
          sVar9 = stbi__get8(s);
          if (CONCAT11(sVar12,sVar9) != uVar44) {
            free(psVar33);
            free(local_8970);
            pcVar40 = "invalid decoded scanline length";
            goto LAB_00340884;
          }
          uVar37 = extraout_RDX;
          if ((local_8970 == (void *)0x0) &&
             (local_8970 = stbi__malloc_mad2(uVar44,4,0), uVar37 = extraout_RDX_00,
             local_8970 == (void *)0x0)) {
            free(psVar33);
            goto LAB_0034269c;
          }
          pvVar30 = local_8970;
          for (local_8950 = 0; local_8950 != 4; local_8950 = local_8950 + 1) {
            lVar47 = 0;
            while( true ) {
              iVar51 = (int)lVar47;
              if ((int)uVar44 <= iVar51) break;
              bVar16 = stbi__get8(s);
              uVar24 = (uint)bVar16;
              uVar49 = (uint)bVar16;
              if (bVar16 < 0x81) {
                if ((uVar49 == 0) || (uVar44 - iVar51 < uVar49)) goto LAB_003420bc;
                lVar47 = (long)iVar51;
                uVar37 = extraout_RDX_01;
                while (bVar66 = uVar24 != 0, uVar24 = uVar24 - 1, bVar66) {
                  sVar9 = stbi__get8(s);
                  *(stbi_uc *)((long)pvVar30 + lVar47 * 4) = sVar9;
                  lVar47 = lVar47 + 1;
                  uVar37 = extraout_RDX_03;
                }
              }
              else {
                sVar9 = stbi__get8(s);
                uVar49 = uVar49 & 0x7f;
                if (uVar44 - iVar51 < uVar49) {
LAB_003420bc:
                  free(psVar33);
                  free(local_8970);
                  pcVar40 = "corrupt";
                  goto LAB_00340884;
                }
                lVar47 = (long)iVar51;
                while (bVar66 = uVar49 != 0, uVar49 = uVar49 - 1, uVar37 = extraout_RDX_02, bVar66)
                {
                  *(stbi_uc *)((long)pvVar30 + lVar47 * 4) = sVar9;
                  lVar47 = lVar47 + 1;
                }
              }
            }
            pvVar30 = (void *)((long)pvVar30 + 1);
          }
          for (lVar47 = 0; (uVar63 & 0xffffffff) << 2 != lVar47; lVar47 = lVar47 + 4) {
            stbi__hdr_convert((float *)(psVar33->huff_dc[0].fast +
                                       (ulong)(uint)((int)local_8960 + (int)lVar47) * 4 + -8),
                              (stbi_uc *)((long)local_8970 + lVar47),(int)uVar37);
            uVar37 = extraout_RDX_04;
          }
          local_8960 = local_8960 + uVar63 * 4;
        }
        free(local_8970);
LAB_0034273b:
        iVar17 = *x;
        iVar51 = *y;
        uVar52 = 0;
        psVar32 = (stbi__uint16 *)stbi__malloc_mad3(iVar17,iVar51,4,0);
        if (psVar32 != (stbi__uint16 *)0x0) {
          uVar44 = iVar51 * iVar17;
          uVar63 = (ulong)uVar44;
          if ((int)uVar44 < 1) {
            uVar63 = uVar52;
          }
          for (; uVar52 != uVar63; uVar52 = uVar52 + 1) {
            for (lVar47 = 0; lVar47 != 3; lVar47 = lVar47 + 1) {
              fVar67 = powf(*(float *)(psVar33->huff_dc[0].fast +
                                      lVar47 * 4 + (ulong)((uint)uVar52 & 0x3fffffff) * 0x10 + -8),
                            0.45454544);
              fVar68 = fVar67 * 255.0 + 0.5;
              fVar67 = 0.0;
              if (0.0 <= fVar68) {
                fVar67 = fVar68;
              }
              fVar68 = 255.0;
              if (fVar67 <= 255.0) {
                fVar68 = fVar67;
              }
              *(uchar *)((long)psVar32 + lVar47 + (ulong)((uint)uVar52 * 4)) = (uchar)(int)fVar68;
            }
            fVar68 = *(float *)(psVar33->huff_dc[0].fast + uVar52 * 0x10 + 4) * 255.0 + 0.5;
            fVar67 = 0.0;
            if (0.0 <= fVar68) {
              fVar67 = fVar68;
            }
            fVar68 = 255.0;
            if (fVar67 <= 255.0) {
              fVar68 = fVar67;
            }
            *(uchar *)((long)psVar32 + uVar52 * 4 + 3) = (uchar)(int)fVar68;
          }
          goto LAB_0033f07f;
        }
LAB_0034270a:
        free(psVar33);
        goto LAB_0034270f;
      }
      stbi__get8(s);
      bVar16 = stbi__get8(s);
      if (bVar16 < 2) {
        bVar15 = stbi__get8(s);
        if (bVar16 == 1) {
          if ((bVar15 & 0xf7) == 1) {
            iVar17 = 4;
            stbi__skip(s,4);
            bVar15 = stbi__get8(s);
            if ((bVar15 < 0x21) && ((0x101018100U >> ((ulong)bVar15 & 0x3f) & 1) != 0))
            goto LAB_003408c1;
          }
          goto LAB_0034068e;
        }
        if ((bVar15 & 0xf6) != 2) goto LAB_0034068e;
        iVar17 = 9;
LAB_003408c1:
        stbi__skip(s,iVar17);
        iVar17 = stbi__get16le(s);
        if ((iVar17 == 0) || (iVar17 = stbi__get16le(s), iVar17 == 0)) goto LAB_0034068e;
        bVar15 = stbi__get8(s);
        if (bVar16 != 1) {
          if ((0x20 < bVar15) || ((0x101018100U >> ((ulong)bVar15 & 0x3f) & 1) == 0))
          goto LAB_0034068e;
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
LAB_00340d4e:
          bVar15 = stbi__get8(s);
          sVar9 = stbi__get8(s);
          bVar11 = stbi__get8(s);
          iVar17 = stbi__get16le(s);
          uVar44 = stbi__get16le(s);
          bVar16 = stbi__get8(s);
          stbi__get16le(s);
          stbi__get16le(s);
          iVar51 = stbi__get16le(s);
          uVar49 = stbi__get16le(s);
          bVar13 = stbi__get8(s);
          pal._0_8_ = (ulong)(uint)pal[1] << 0x20;
          bVar14 = stbi__get8(s);
          _value = (stbi_uc *)((ulong)_value & 0xffffffff00000000);
          if (sVar9 == '\0') {
            uVar24 = bVar11 - 8;
            if (bVar11 < 8) {
              uVar24 = (uint)bVar11;
            }
            uVar24 = (uint)(uVar24 == 3);
            bVar16 = bVar13;
          }
          else {
            uVar24 = 0;
          }
          uVar24 = stbi__tga_get_comp((uint)bVar16,uVar24,(int *)pal);
          if (uVar24 == 0) {
            lVar47 = *in_FS_OFFSET;
            pcVar40 = "bad format";
            goto LAB_00342722;
          }
          *x = iVar51;
          *y = uVar49;
          if (comp != (int *)0x0) {
            *comp = uVar24;
          }
          iVar54 = stbi__mad3sizes_valid(iVar51,uVar49,uVar24,0);
          if (iVar54 == 0) goto LAB_0034188e;
          psVar33 = (stbi__jpeg *)stbi__malloc_mad3(iVar51,uVar49,uVar24,0);
          if (psVar33 == (stbi__jpeg *)0x0) goto LAB_0034270f;
          stbi__skip(s,(uint)bVar15);
          uVar52 = (ulong)uVar24;
          if (((sVar9 == '\0') && (bVar11 < 8)) && (pal[0] == (stbi_uc  [4])0x0)) {
            uVar25 = 0;
            uVar44 = uVar49;
            while( true ) {
              uVar44 = uVar44 - 1;
              uVar26 = (uint)piVar61;
              if (uVar44 == 0xffffffff) break;
              uVar26 = uVar25;
              if ((bVar14 >> 5 & 1) == 0) {
                uVar26 = uVar44;
              }
              stbi__getn(s,psVar33->huff_dc[0].fast + (long)(int)(uVar26 * uVar24 * iVar51) + -8,
                         uVar24 * iVar51);
              uVar25 = uVar25 + 1;
            }
            goto LAB_0034228e;
          }
          if (sVar9 == '\0') {
            local_8948 = (stbi__jpeg *)0x0;
          }
          else {
            if (uVar44 == 0) {
LAB_00342595:
              free(psVar33);
              lVar47 = *in_FS_OFFSET;
              pcVar40 = "bad palette";
              goto LAB_00342722;
            }
            stbi__skip(s,iVar17);
            local_8948 = (stbi__jpeg *)stbi__malloc_mad2(uVar44,uVar24,0);
            if (local_8948 == (stbi__jpeg *)0x0) goto LAB_0034270a;
            if (pal[0] == (stbi_uc  [4])0x0) {
              iVar17 = stbi__getn(s,(stbi_uc *)local_8948,uVar24 * uVar44);
              if (iVar17 == 0) {
                free(psVar33);
                psVar33 = local_8948;
                goto LAB_00342595;
              }
            }
            else {
              if (uVar24 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image.h"
                              ,0x1746,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              for (lVar47 = 0; uVar44 * 3 != (int)lVar47; lVar47 = lVar47 + 3) {
                stbi__tga_read_rgb16(s,local_8948->huff_dc[0].fast + lVar47 + -8);
              }
            }
          }
          bVar66 = true;
          iVar17 = 0;
          uVar25 = 0;
          psVar48 = psVar33;
          for (uVar63 = 0; uVar26 = (uint)piVar61, uVar63 != uVar49 * iVar51; uVar63 = uVar63 + 1) {
            if (bVar11 < 8) {
LAB_00342163:
              if (sVar9 == '\0') {
                if (pal[0] == (stbi_uc  [4])0x0) {
                  for (uVar41 = 0; uVar52 != uVar41; uVar41 = uVar41 + 1) {
                    sVar10 = stbi__get8(s);
                    value[uVar41] = sVar10;
                  }
                }
                else {
                  if (uVar24 != 3) {
                    __assert_fail("tga_comp == STBI_rgb",
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image.h"
                                  ,0x1777,
                                  "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                 );
                  }
                  stbi__tga_read_rgb16(s,value);
                }
              }
              else {
                if (bVar13 == 8) {
                  bVar16 = stbi__get8(s);
                  uVar26 = (uint)bVar16;
                }
                else {
                  uVar26 = stbi__get16le(s);
                }
                if (uVar44 <= uVar26) {
                  uVar26 = 0;
                }
                for (uVar41 = 0; uVar52 != uVar41; uVar41 = uVar41 + 1) {
                  value[uVar41] = local_8948->huff_dc[0].fast[uVar41 + uVar26 * uVar24 + -8];
                }
              }
            }
            else {
              if (iVar17 == 0) {
                bVar16 = stbi__get8(s);
                iVar17 = (bVar16 & 0x7f) + 1;
                uVar25 = (uint)(bVar16 >> 7);
                goto LAB_00342163;
              }
              if (uVar25 == 0 || bVar66) {
                uVar25 = (uint)(uVar25 != 0);
                goto LAB_00342163;
              }
              uVar25 = 1;
            }
            for (uVar41 = 0; uVar52 != uVar41; uVar41 = uVar41 + 1) {
              psVar48->huff_dc[0].fast[uVar41 - 8] = value[uVar41];
            }
            iVar17 = iVar17 + -1;
            psVar48 = (stbi__jpeg *)(psVar48->huff_dc[0].fast + (uVar52 - 8));
            bVar66 = false;
          }
          if ((bVar14 >> 5 & 1) == 0) {
            iVar17 = uVar24 * iVar51;
            iVar54 = (uVar49 - 1) * iVar17;
            uVar44 = 0;
            for (uVar25 = 0; uVar26 = (uint)piVar61, uVar25 != uVar49 + 1 >> 1; uVar25 = uVar25 + 1)
            {
              piVar61 = (int *)(long)iVar54;
              psVar48 = psVar33;
              for (iVar56 = iVar17; 0 < iVar56; iVar56 = iVar56 + -1) {
                sVar9 = psVar48->huff_dc[0].fast[(ulong)uVar44 - 8];
                psVar48->huff_dc[0].fast[(ulong)uVar44 - 8] =
                     psVar48->huff_dc[0].fast[(long)(piVar61 + -2)];
                psVar48->huff_dc[0].fast[(long)(piVar61 + -2)] = sVar9;
                psVar48 = (stbi__jpeg *)((long)&psVar48->s + 1);
              }
              uVar44 = uVar44 + iVar17;
              iVar54 = iVar54 - iVar17;
            }
          }
          free(local_8948);
LAB_0034228e:
          if ((2 < uVar24) && (pal[0] == (stbi_uc  [4])0x0)) {
            iVar17 = uVar49 * iVar51;
            puVar42 = (undefined1 *)((long)&psVar33->s + 2);
            while (bVar66 = iVar17 != 0, iVar17 = iVar17 + -1, bVar66) {
              uVar38 = puVar42[-2];
              puVar42[-2] = *puVar42;
              *puVar42 = uVar38;
              puVar42 = puVar42 + uVar52;
            }
          }
          if (uVar24 != 4) {
            puVar58 = stbi__convert_format((uchar *)psVar33,uVar24,iVar51,uVar49,uVar26);
            return puVar58;
          }
          return psVar33;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if ((bVar15 - 8 & 0xf7) == 0) goto LAB_00340d4e;
      }
      else {
LAB_0034068e:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      lVar47 = *in_FS_OFFSET;
      pcVar40 = "unknown image type";
      goto LAB_00342722;
    }
    y_00 = &s->img_y;
    piVar61 = &s->img_n;
    iVar17 = stbi__pnm_info(s,(int *)s,(int *)y_00,piVar61);
    *piVar59 = iVar17;
    if (iVar17 == 0) {
      return (void *)0x0;
    }
    if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      sVar18 = *y_00;
      *y = sVar18;
      iVar17 = *piVar61;
      if (comp != (int *)0x0) {
        *comp = iVar17;
        sVar18 = *y_00;
      }
      sVar21 = s->img_x;
      iVar51 = *piVar59 / 8;
      iVar54 = stbi__mad4sizes_valid(iVar17,sVar21,sVar18,iVar51,uVar44);
      if (iVar54 != 0) {
        psVar32 = (stbi__uint16 *)stbi__malloc_mad4(iVar17,sVar21,sVar18,iVar51,uVar44);
        if (psVar32 != (stbi__uint16 *)0x0) {
          iVar17 = stbi__getn(s,(stbi_uc *)psVar32,sVar18 * iVar17 * sVar21 * iVar51);
          if (iVar17 != 0) {
            iVar17 = *piVar61;
            if (iVar17 == 4) {
              return psVar32;
            }
            if (*piVar59 != 0x10) {
              puVar58 = stbi__convert_format((uchar *)psVar32,iVar17,s->img_x,s->img_y,uVar44);
              return puVar58;
            }
            psVar32 = stbi__convert_format16(psVar32,iVar17,s->img_x,s->img_y,uVar44);
            return psVar32;
          }
          free(psVar32);
          lVar47 = *in_FS_OFFSET;
          pcVar40 = "bad PNM";
          goto LAB_00342722;
        }
        goto LAB_0034270f;
      }
    }
  }
LAB_0034188e:
  lVar47 = *in_FS_OFFSET;
  pcVar40 = "too large";
LAB_00342722:
  *(char **)(lVar47 + -8) = pcVar40;
  return (void *)0x0;
LAB_003426a8:
  pcVar40 = "illegal code in raster";
  goto LAB_0034099b;
LAB_0034091d:
  lVar47 = *in_FS_OFFSET;
  pcVar40 = "bad file";
LAB_00340930:
  *(char **)(lVar47 + -8) = pcVar40;
LAB_00340941:
  free(pvVar30);
  pvVar30 = (void *)0x0;
  goto LAB_00340950;
LAB_00340c21:
  pcVar40 = "bad huffman code";
LAB_00341433:
  *(char **)(*in_FS_OFFSET + -8) = pcVar40;
  goto LAB_0034144e;
LAB_00342501:
  do {
    stbi__skip(s,n);
    bVar16 = stbi__get8(s);
    n = (uint)bVar16;
  } while (bVar16 != 0);
LAB_0034251a:
  if (pal._8_8_ == 0) {
LAB_003409ae:
    free((void *)pal._8_8_);
    psVar32 = (stbi__uint16 *)0x0;
  }
  else {
    if (0 < (int)pal[9]) {
      uVar63 = 0;
      uVar52 = (ulong)(uint)((int)pal[0] * (int)pal[1]);
      if ((int)pal[0] * (int)pal[1] < 1) {
        uVar52 = uVar63;
      }
      for (; uVar52 != uVar63; uVar63 = uVar63 + 1) {
        if (*(char *)(pal._24_8_ + uVar63) == '\0') {
          pal[(long)(int)pal[9] + 0xd][3] = 0xff;
          *(stbi_uc (*) [4])(pal._8_8_ + uVar63 * 4) = pal[(long)(int)pal[9] + 0xd];
        }
      }
    }
    if ((stbi__context *)pal._8_8_ == s) goto LAB_003409ae;
    *x = (int)pal[0];
    *y = (int)pal[1];
    psVar32 = (stbi__uint16 *)pal._8_8_;
  }
  free((void *)pal._24_8_);
  psVar33 = (stbi__jpeg *)pal._16_8_;
LAB_0033f07f:
  free(psVar33);
  return psVar32;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}